

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O2

RGBSigmoidPolynomial __thiscall pbrt::RGBColorSpace::ToRGBCoeffs(RGBColorSpace *this,RGB *rgb)

{
  RGBToSpectrumTable *this_00;
  undefined1 auVar2 [56];
  undefined1 auVar1 [64];
  RGB RVar3;
  RGBSigmoidPolynomial RVar4;
  RGB local_18;
  
  if (((0.0 <= rgb->r) && (0.0 <= rgb->g)) && (auVar2 = (undefined1  [56])0x0, 0.0 <= rgb->b)) {
    this_00 = this->rgbToSpectrumTable;
    RVar3 = ClampZero(rgb);
    local_18.b = RVar3.b;
    auVar1._0_8_ = RVar3._0_8_;
    auVar1._8_56_ = auVar2;
    local_18._0_8_ = vmovlps_avx(auVar1._0_16_);
    RVar4 = RGBToSpectrumTable::operator()(this_00,&local_18);
    return RVar4;
  }
  LogFatal<char_const(&)[39]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/colorspace.cpp"
             ,0x2c,"Check failed: %s",(char (*) [39])"rgb.r >= 0 && rgb.g >= 0 && rgb.b >= 0");
}

Assistant:

RGBSigmoidPolynomial RGBColorSpace::ToRGBCoeffs(const RGB &rgb) const {
    CHECK(rgb.r >= 0 && rgb.g >= 0 && rgb.b >= 0);
    return (*rgbToSpectrumTable)(ClampZero(rgb));
}